

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O1

sexp analyze_if(sexp ctx,sexp x,int depth)

{
  sexp psVar1;
  sexp psVar2;
  sexp psVar3;
  char *message;
  sexp psVar4;
  sexp pass;
  sexp test;
  sexp fail;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_gc_var_t __sexp_gc_preserver3;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp local_80;
  sexp local_78;
  sexp local_70;
  sexp_gc_var_t local_68;
  sexp_gc_var_t local_58;
  sexp_gc_var_t local_48;
  
  local_68.var = &local_78;
  local_78 = (sexp)0x43e;
  local_48.next = &local_68;
  local_48.var = &local_80;
  local_80 = (sexp)0x43e;
  local_58.next = &local_48;
  local_58.var = &local_70;
  local_70 = (sexp)0x43e;
  local_68.next = (ctx->value).context.saves;
  (ctx->value).context.saves = local_48.next;
  (ctx->value).context.saves = local_58.next;
  (ctx->value).context.saves = &local_58;
  psVar2 = (x->value).type.cpl;
  if ((((((ulong)psVar2 & 3) == 0) && (psVar2->tag == 6)) &&
      (psVar4 = (psVar2->value).type.cpl, ((ulong)psVar4 & 3) == 0)) && (psVar4->tag == 6)) {
    psVar4 = (psVar4->value).type.cpl;
    if (((((ulong)psVar4 & 3) != 0) || (psVar4->tag != 6)) ||
       ((psVar4->value).type.cpl == (sexp)0x23e)) {
      local_78 = analyze(ctx,(psVar2->value).type.name,depth,0);
      if ((((ulong)local_78 & 3) != 0) || (psVar2 = local_78, local_78->tag != 0x13)) {
        local_80 = analyze(ctx,(((((x->value).type.cpl)->value).type.cpl)->value).type.name,depth,0)
        ;
        if ((((ulong)local_80 & 3) != 0) || (psVar2 = local_80, local_80->tag != 0x13)) {
          psVar2 = (((((x->value).type.cpl)->value).type.cpl)->value).type.cpl;
          psVar4 = (sexp)&DAT_0000043e;
          if ((((ulong)psVar2 & 3) == 0) && (psVar2->tag == 6)) {
            psVar4 = (psVar2->value).type.name;
          }
          psVar3 = analyze(ctx,psVar4,depth,0);
          psVar1 = local_78;
          psVar4 = local_80;
          if ((((ulong)psVar3 & 3) != 0) || (psVar2 = psVar3, psVar3->tag != 0x13)) {
            local_70 = psVar3;
            psVar2 = sexp_alloc_tagged_aux(ctx,0x28,0x1d);
            (psVar2->value).type.name = psVar1;
            (psVar2->value).type.cpl = psVar4;
            (psVar2->value).type.slots = psVar3;
          }
        }
      }
      if ((((ulong)psVar2 & 3) == 0) && (psVar2->tag == 0x1d)) {
        (psVar2->value).type.getters = (x->value).type.slots;
      }
      goto LAB_0012cf5b;
    }
    message = "too many args to if";
  }
  else {
    message = "not enough args to if";
  }
  psVar2 = sexp_compile_error(ctx,message,x);
LAB_0012cf5b:
  (ctx->value).context.saves = local_68.next;
  return psVar2;
}

Assistant:

static sexp analyze_if (sexp ctx, sexp x, int depth) {
  sexp res, fail_expr;
  sexp_gc_var3(test, pass, fail);
  sexp_gc_preserve3(ctx, test, pass, fail);
  if (! (sexp_pairp(sexp_cdr(x)) && sexp_pairp(sexp_cddr(x)))) {
    res = sexp_compile_error(ctx, "not enough args to if", x);
  } else if (sexp_pairp(sexp_cdddr(x)) && sexp_cdr(sexp_cdddr(x)) != SEXP_NULL) {
    res = sexp_compile_error(ctx, "too many args to if", x);
  } else {
    test = analyze(ctx, sexp_cadr(x), depth, 0);
    if (sexp_exceptionp(test)) {
      res = test;
    } else {
      pass = analyze(ctx, sexp_caddr(x), depth, 0);
      if (sexp_exceptionp(pass)) {
        res = pass;
      } else {
        fail_expr = sexp_pairp(sexp_cdddr(x)) ? sexp_cadddr(x) : SEXP_VOID;
        fail = analyze(ctx, fail_expr, depth, 0);
        res = sexp_exceptionp(fail) ? fail : sexp_make_cnd(ctx, test, pass, fail);
      }
    }
    if (sexp_cndp(res)) sexp_cnd_source(res) = sexp_pair_source(x);
  }
  sexp_gc_release3(ctx);
  return res;
}